

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void xmlListReverse(xmlListPtr l)

{
  xmlLinkPtr pxVar1;
  xmlLinkPtr pxVar2;
  xmlLinkPtr pxVar3;
  
  if (l != (xmlListPtr)0x0) {
    pxVar1 = l->sentinel;
    pxVar2 = pxVar1;
    for (pxVar3 = pxVar1->next; pxVar3 != pxVar1; pxVar3 = pxVar3->next) {
      pxVar2->next = pxVar2->prev;
      pxVar2->prev = pxVar3;
      pxVar2 = pxVar3;
    }
    pxVar2->next = pxVar2->prev;
    pxVar2->prev = pxVar3;
  }
  return;
}

Assistant:

void
xmlListReverse(xmlListPtr l)
{
    xmlLinkPtr lk;
    xmlLinkPtr lkPrev;

    if (l == NULL)
        return;
    lkPrev = l->sentinel;
    for (lk = l->sentinel->next; lk != l->sentinel; lk = lk->next) {
        lkPrev->next = lkPrev->prev;
        lkPrev->prev = lk;
        lkPrev = lk;
    }
    /* Fix up the last node */
    lkPrev->next = lkPrev->prev;
    lkPrev->prev = lk;
}